

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerHLSL::to_resource_register_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,HLSLBindingFlagBits flag,char space,
          uint32_t binding,uint32_t space_set)

{
  allocator *paVar1;
  undefined4 in_register_0000008c;
  char (*ts_3) [2];
  char (*in_stack_ffffffffffffffd0) [2];
  char local_25;
  uint32_t local_24;
  uint32_t local_20;
  allocator local_1a;
  allocator local_19;
  
  ts_3 = (char (*) [2])CONCAT44(in_register_0000008c,space_set);
  local_25 = space;
  local_24 = space_set;
  local_20 = binding;
  if ((this->resource_binding_flags & flag) == HLSL_BINDING_AUTO_NONE_BIT) {
    remap_hlsl_resource_binding(this,flag,&local_24,&local_20);
    if ((flag != HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT) || (local_24 != 0xffffffff)) {
      if (0x32 < (this->hlsl_options).shader_model) {
        join<char_const(&)[13],char&,unsigned_int&,char_const(&)[8],unsigned_int&,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)" : register(",(char (*) [13])&local_25,
                   (char *)&local_20,(uint *)", space",(char (*) [8])&local_24,(uint *)0x27e75d,
                   in_stack_ffffffffffffffd0);
        return __return_storage_ptr__;
      }
      join<char_const(&)[13],char&,unsigned_int&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)" : register(",(char (*) [13])&local_25,
                 (char *)&local_20,(uint *)0x27e75d,ts_3);
      return __return_storage_ptr__;
    }
    paVar1 = &local_19;
  }
  else {
    paVar1 = &local_1a;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_resource_register(HLSLBindingFlagBits flag, char space, uint32_t binding, uint32_t space_set)
{
	if ((flag & resource_binding_flags) == 0)
	{
		remap_hlsl_resource_binding(flag, space_set, binding);

		// The push constant block did not have a binding, and there were no remap for it,
		// so, declare without register binding.
		if (flag == HLSL_BINDING_AUTO_PUSH_CONSTANT_BIT && space_set == ResourceBindingPushConstantDescriptorSet)
			return "";

		if (hlsl_options.shader_model >= 51)
			return join(" : register(", space, binding, ", space", space_set, ")");
		else
			return join(" : register(", space, binding, ")");
	}
	else
		return "";
}